

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::FBmTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FBmTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::TextureMapping3DHandle_const&,float_const&,int_const&>
            (__return_storage_ptr__,"[ FBmTexture mapping: %s omega: %f octaves: %d ]",
             &this->mapping,&this->omega,&this->octaves);
  return __return_storage_ptr__;
}

Assistant:

std::string FBmTexture::ToString() const {
    return StringPrintf("[ FBmTexture mapping: %s omega: %f octaves: %d ]", mapping,
                        omega, octaves);
}